

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O3

void __thiscall QStyleOptionTab::QStyleOptionTab(QStyleOptionTab *this,int version)

{
  QStyleOption::QStyleOption(&this->super_QStyleOption,version,3);
  this->shape = RoundedNorth;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  QIcon::QIcon(&this->icon);
  this->row = 0;
  this->position = Beginning;
  this->selectedPosition = NotAdjacent;
  this->cornerWidgets = (QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>)0x0;
  (this->iconSize).wd = -1;
  (this->iconSize).ht = -1;
  this->documentMode = false;
  (this->leftButtonSize).wd.m_i = -1;
  (this->leftButtonSize).ht.m_i = -1;
  (this->rightButtonSize).wd.m_i = -1;
  (this->rightButtonSize).ht.m_i = -1;
  this->features = (QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>)0x0;
  this->tabIndex = -1;
  return;
}

Assistant:

QStyleOptionTab::QStyleOptionTab(int version)
    : QStyleOption(version, SO_Tab),
      shape(QTabBar::RoundedNorth),
      row(0),
      position(Beginning),
      selectedPosition(NotAdjacent), cornerWidgets(QStyleOptionTab::NoCornerWidgets),
      documentMode(false),
      features(QStyleOptionTab::None)
{
}